

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O1

ChVector<double> * chrono::fea::Interp(ChVector<double> *v,double *xi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  ChVector<double> *r;
  ChVector<double> *in_RDI;
  
  dVar13 = (*xi + 1.0) * 0.25;
  dVar12 = xi[1] + 1.0;
  dVar14 = dVar13 * dVar12;
  dVar1 = v->m_data[0];
  dVar2 = v->m_data[1];
  dVar3 = v->m_data[2];
  dVar15 = (1.0 - *xi) * 0.25;
  dVar12 = dVar15 * dVar12;
  dVar4 = v[1].m_data[0];
  dVar5 = v[1].m_data[1];
  dVar6 = v[1].m_data[2];
  dVar16 = 1.0 - xi[1];
  dVar15 = dVar15 * dVar16;
  dVar7 = v[2].m_data[0];
  dVar8 = v[2].m_data[1];
  dVar9 = v[2].m_data[2];
  dVar13 = dVar13 * dVar16;
  dVar16 = v[3].m_data[0];
  dVar10 = v[3].m_data[1];
  dVar11 = v[3].m_data[2];
  in_RDI->m_data[0] = 0.0;
  in_RDI->m_data[1] = 0.0;
  in_RDI->m_data[0] = dVar14 * dVar1 + dVar12 * dVar4 + dVar15 * dVar7 + dVar13 * dVar16;
  in_RDI->m_data[1] = dVar14 * dVar2 + dVar12 * dVar5 + dVar15 * dVar8 + dVar13 * dVar10;
  in_RDI->m_data[2] = dVar14 * dVar3 + dVar12 * dVar6 + dVar15 * dVar9 + dVar13 * dVar11;
  return in_RDI;
}

Assistant:

static ChVector<> Interp(const ChVector<>* const v, const double xi[2]) {
    ChVector<> r = v[0] * L1(xi) + v[1] * L2(xi) + v[2] * L3(xi) + v[3] * L4(xi);
    return r;
}